

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBoolean.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptBoolean::GetDiagValueString
          (JavascriptBoolean *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  BOOL BVar1;
  charcount_t cVar2;
  JavascriptLibrary *pJVar3;
  JavascriptString *pJVar4;
  char16 *pcVar5;
  JavascriptString *falseDisplayString;
  JavascriptString *trueDisplayString;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  JavascriptBoolean *this_local;
  
  BVar1 = GetValue(this);
  if (BVar1 == 0) {
    pJVar3 = RecyclableObject::GetLibrary(&this->super_RecyclableObject);
    pJVar4 = JavascriptLibrary::GetFalseDisplayString(pJVar3);
    pcVar5 = JavascriptString::GetString(pJVar4);
    cVar2 = JavascriptString::GetLength(pJVar4);
    StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,pcVar5,cVar2);
  }
  else {
    pJVar3 = RecyclableObject::GetLibrary(&this->super_RecyclableObject);
    pJVar4 = JavascriptLibrary::GetTrueDisplayString(pJVar3);
    pcVar5 = JavascriptString::GetString(pJVar4);
    cVar2 = JavascriptString::GetLength(pJVar4);
    StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,pcVar5,cVar2);
  }
  return 1;
}

Assistant:

BOOL JavascriptBoolean::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        if (this->GetValue())
        {
            JavascriptString* trueDisplayString = GetLibrary()->GetTrueDisplayString();
            stringBuilder->Append(trueDisplayString->GetString(), trueDisplayString->GetLength());
        }
        else
        {
            JavascriptString* falseDisplayString = GetLibrary()->GetFalseDisplayString();
            stringBuilder->Append(falseDisplayString->GetString(), falseDisplayString->GetLength());
        }
        return TRUE;
    }